

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

word * Dau_DsdToTruth(char *p,int nVars)

{
  word *pRes_00;
  char *pStr;
  int nWords_00;
  int iVar1;
  word **pTtElems_00;
  int *pMatches;
  word *pRes;
  word **pTtElems;
  int nWords;
  int nVars_local;
  char *p_local;
  
  _nWords = p;
  nWords_00 = Abc_TtWordNum(nVars);
  pTtElems_00 = Dau_DsdTtElems();
  pRes_00 = pTtElems_00[0xc];
  if (0xc < nVars) {
    __assert_fail("nVars <= DAU_MAX_VAR",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauDsd.c"
                  ,0x266,"word *Dau_DsdToTruth(char *, int)");
  }
  iVar1 = Dau_DsdIsConst0(_nWords);
  if (iVar1 == 0) {
    iVar1 = Dau_DsdIsConst1(_nWords);
    pStr = _nWords;
    if (iVar1 == 0) {
      pMatches = Dau_DsdComputeMatches(_nWords);
      Dau_DsdToTruth_rec(pStr,(char **)&nWords,pMatches,pTtElems_00,pRes_00,nVars);
    }
    else {
      Abc_TtConst1(pRes_00,nWords_00);
    }
  }
  else {
    Abc_TtConst0(pRes_00,nWords_00);
  }
  if (_nWords[1] != '\0') {
    _nWords = _nWords + 1;
    __assert_fail("*++p == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauDsd.c"
                  ,0x26d,"word *Dau_DsdToTruth(char *, int)");
  }
  return pRes_00;
}

Assistant:

word * Dau_DsdToTruth( char * p, int nVars )
{
    int nWords = Abc_TtWordNum( nVars );
    word ** pTtElems = Dau_DsdTtElems();
    word * pRes = pTtElems[DAU_MAX_VAR];
    assert( nVars <= DAU_MAX_VAR );
    if ( Dau_DsdIsConst0(p) )
        Abc_TtConst0( pRes, nWords );
    else if ( Dau_DsdIsConst1(p) )
        Abc_TtConst1( pRes, nWords );
    else
        Dau_DsdToTruth_rec( p, &p, Dau_DsdComputeMatches(p), pTtElems, pRes, nVars );
    assert( *++p == 0 );
    return pRes;
}